

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsFindWord(char *pStr,char *pWord,int *fFound)

{
  int iVar1;
  char *pStr_00;
  size_t sVar2;
  
  *fFound = 0;
  pStr_00 = Wlc_PrsSkipSpaces(pStr);
  iVar1 = Wlc_PrsStrCmp(pStr_00,pWord);
  if (iVar1 != 0) {
    *fFound = 1;
    sVar2 = strlen(pWord);
    pStr_00 = pStr_00 + sVar2;
  }
  return pStr_00;
}

Assistant:

static inline char * Wlc_PrsFindWord( char * pStr, char * pWord, int * fFound )
{
    *fFound = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsStrCmp(pStr, pWord) )
        return pStr;
    *fFound = 1;
    return pStr + strlen(pWord);
}